

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void unlink_easy(Curl_multi *multi,Curl_easy *data)

{
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  if (data->prev == (Curl_easy *)0x0) {
    multi->easyp = data->next;
  }
  else {
    data->prev->next = data->next;
  }
  if (data->next == (Curl_easy *)0x0) {
    multi->easylp = data->prev;
  }
  else {
    data->next->prev = data->prev;
  }
  data->next = (Curl_easy *)0x0;
  data->prev = (Curl_easy *)0x0;
  return;
}

Assistant:

static void unlink_easy(struct Curl_multi *multi,
                        struct Curl_easy *data)
{
  /* make the previous node point to our next */
  if(data->prev)
    data->prev->next = data->next;
  else
    multi->easyp = data->next; /* point to first node */

  /* make our next point to our previous node */
  if(data->next)
    data->next->prev = data->prev;
  else
    multi->easylp = data->prev; /* point to last node */

  data->prev = data->next = NULL;
}